

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar3;
  ImVec2 IVar2;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImRect IVar8;
  
  fVar5 = (window->Pos).x;
  fVar1 = (window->Size).x + fVar5;
  fVar6 = (window->Pos).y;
  fVar3 = (window->Size).y + fVar6;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar1 = fVar1 + -1.0;
    fVar3 = fVar3 + -1.0;
  }
  switch(border_n) {
  case 0:
    fVar4 = fVar5 + perp_padding;
    fVar7 = fVar6 - thickness;
    IVar2.x = fVar1 - perp_padding;
    IVar2.y = fVar6 + thickness;
    break;
  case 1:
    fVar4 = fVar1 - thickness;
    fVar7 = fVar6 + perp_padding;
    IVar2.y = fVar3 - perp_padding;
    IVar2.x = thickness + fVar1;
    break;
  case 2:
    fVar4 = fVar5 + perp_padding;
    fVar7 = fVar3 - thickness;
    IVar2.x = fVar1 - perp_padding;
    IVar2.y = fVar3 + thickness;
    break;
  case 3:
    fVar4 = fVar5 - thickness;
    fVar7 = fVar6 + perp_padding;
    IVar2.y = fVar3 - perp_padding;
    IVar2.x = fVar5 + thickness;
    break;
  default:
    IVar2.x = -3.4028235e+38;
    IVar2.y = -3.4028235e+38;
    fVar4 = 3.4028235e+38;
    fVar7 = 3.4028235e+38;
  }
  IVar8.Min.y = fVar7;
  IVar8.Min.x = fVar4;
  IVar8.Max = IVar2;
  return IVar8;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1,1);
    if (border_n == 0) return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);
    if (border_n == 1) return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding);
    if (border_n == 2) return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);
    if (border_n == 3) return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding);
    IM_ASSERT(0);
    return ImRect();
}